

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyListValue::~IfcPropertyListValue(IfcPropertyListValue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  *(undefined ***)this = &PTR__IfcPropertyListValue_00855630;
  *(undefined ***)&this->field_0xa8 = &PTR__IfcPropertyListValue_008556a8;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyListValue_00855658;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>)._vptr_ObjectHelper
       = (_func_int **)&PTR__IfcPropertyListValue_00855680;
  this_00 = (this->Unit).ptr.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
                field_0x10);
  *(undefined8 *)this = 0x8557c0;
  *(undefined8 *)&this->field_0xa8 = 0x8557e8;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
    return;
  }
  return;
}

Assistant:

IfcPropertyListValue() : Object("IfcPropertyListValue") {}